

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDecompress.c
# Opt level: O0

USTATUS LzmaGetInfo(void *Source,UINT32 SourceSize,UINT32 *DestinationSize)

{
  UINT64 UVar1;
  UINT64 DecodedSize;
  UINT32 *DestinationSize_local;
  UINT32 SourceSize_local;
  void *Source_local;
  
  if (SourceSize < 0xd) {
    __assert_fail("SourceSize >= (5 + 8)",
                  "/workspace/llm4binary/github/license_c_cmakelists/LongSoft[P]UEFITool/common/LZMA/LzmaDecompress.c"
                  ,0x61,"USTATUS LzmaGetInfo(const void *, UINT32, UINT32 *)");
  }
  UVar1 = GetDecodedSizeOfBuf((UINT8 *)Source);
  if (0xffffffff >= UVar1) {
    *DestinationSize = (UINT32)UVar1;
  }
  Source_local = (void *)(ulong)(0xffffffff < UVar1);
  return (USTATUS)Source_local;
}

Assistant:

USTATUS
EFIAPI
LzmaGetInfo (
    CONST VOID  *Source,
    UINT32       SourceSize,
    UINT32       *DestinationSize
    )
{
    UINT64 DecodedSize;
    ASSERT(SourceSize >= LZMA_HEADER_SIZE);
    (void)SourceSize;

    DecodedSize = GetDecodedSizeOfBuf((UINT8*)Source);

    if (DecodedSize <= UINT32_MAX) {
        *DestinationSize = (UINT32)DecodedSize;
        return U_SUCCESS;
    }
    else {
        return U_INVALID_PARAMETER;
    }
}